

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O2

void __thiscall dna_string::build_rank_support(dna_string *this)

{
  pointer ppVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong superblock_number;
  uint64_t uVar5;
  undefined4 uVar6;
  long lVar7;
  uint64_t uVar8;
  ulong uVar9;
  undefined4 uVar10;
  long lVar11;
  uint64_t uVar12;
  undefined4 uVar13;
  long lVar14;
  undefined4 uVar15;
  long lVar16;
  uint64_t uVar17;
  p_rank local_rank;
  p_rank local_50;
  
  lVar11 = 0;
  lVar14 = 0;
  lVar7 = 0;
  lVar16 = 0;
  uVar8 = 0;
  uVar5 = 0;
  uVar17 = 0;
  uVar12 = 0;
  uVar4 = 0;
  while( true ) {
    uVar15 = (undefined4)lVar16;
    uVar10 = (undefined4)lVar11;
    uVar13 = (undefined4)lVar14;
    uVar6 = (undefined4)lVar7;
    uVar3 = this->n_blocks - 1;
    if (uVar3 <= uVar4) break;
    superblock_number = uVar4 >> 0x19;
    uVar3 = uVar4 & 0x1ffffff;
    if (uVar3 == 0) {
      ppVar1 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppVar1[superblock_number].A = uVar12;
      ppVar1[superblock_number].C = uVar17;
      ppVar1[superblock_number].G = uVar5;
      ppVar1[superblock_number].T = uVar8;
      lVar11 = 0;
      lVar14 = 0;
      lVar7 = 0;
      lVar16 = 0;
    }
    puVar2 = this->data;
    uVar9 = (ulong)(uint)((int)uVar3 << 6);
    *(int *)(puVar2 + uVar9 + 0x30 + superblock_number * 0x80000000) = (int)lVar16;
    *(int *)(puVar2 + uVar9 + 0x34 + superblock_number * 0x80000000) = (int)lVar7;
    *(int *)(puVar2 + uVar9 + 0x38 + superblock_number * 0x80000000) = (int)lVar14;
    *(int *)(puVar2 + uVar9 + 0x3c + superblock_number * 0x80000000) = (int)lVar11;
    block_rank(&local_50,this,superblock_number,uVar3);
    lVar16 = lVar16 + local_50.A;
    lVar7 = lVar7 + local_50.C;
    lVar14 = lVar14 + local_50.G;
    lVar11 = lVar11 + local_50.T;
    uVar12 = uVar12 + local_50.A;
    uVar17 = uVar17 + local_50.C;
    uVar5 = uVar5 + local_50.G;
    uVar8 = uVar8 + local_50.T;
    uVar4 = uVar4 + 1;
  }
  uVar4 = uVar3 >> 0x19;
  if ((uVar3 & 0x1ffffff) == 0) {
    ppVar1 = (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar1[uVar4].A = uVar12;
    ppVar1[uVar4].C = uVar17;
    ppVar1[uVar4].G = uVar5;
    ppVar1[uVar4].T = uVar8;
    uVar10 = 0;
    uVar13 = 0;
    uVar6 = 0;
    uVar15 = 0;
  }
  puVar2 = this->data;
  uVar3 = (ulong)(uint)((int)(uVar3 & 0x1ffffff) << 6);
  *(undefined4 *)(puVar2 + uVar3 + 0x30 + uVar4 * 0x80000000) = uVar15;
  *(undefined4 *)(puVar2 + uVar3 + 0x34 + uVar4 * 0x80000000) = uVar6;
  *(undefined4 *)(puVar2 + uVar3 + 0x38 + uVar4 * 0x80000000) = uVar13;
  *(undefined4 *)(puVar2 + uVar3 + 0x3c + uVar4 * 0x80000000) = uVar10;
  return;
}

Assistant:

void build_rank_support(){

		p_rank superblock_r = {};
		p_rank block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

		assert(check_rank());

	}